

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_ManStrCheck(char *pStr,int *pnInps,int *pnObjs)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  char *format;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  int Marks [32];
  undefined4 auStack_21c [95];
  undefined8 uStack_a0;
  int local_98 [34];
  
  local_98[0x1c] = 0;
  local_98[0x1d] = 0;
  local_98[0x1e] = 0;
  local_98[0x1f] = 0;
  local_98[0x18] = 0;
  local_98[0x19] = 0;
  local_98[0x1a] = 0;
  local_98[0x1b] = 0;
  local_98[0x14] = 0;
  local_98[0x15] = 0;
  local_98[0x16] = 0;
  local_98[0x17] = 0;
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  iVar4 = -1;
  iVar5 = 0;
  pbVar6 = (byte *)pStr;
LAB_004393f0:
  bVar1 = *pbVar6;
  iVar7 = 1;
  if (bVar1 < 0x5b) {
    if ((bVar1 != 0x28) && (bVar1 != 0x3c)) {
      if (bVar1 == 0) {
        if (iVar4 < 0) goto LAB_0043948c;
        uVar3 = 0;
        while (local_98[uVar3] != 0) {
          uVar3 = uVar3 + 1;
          if (iVar4 + 1 == uVar3) {
LAB_0043948c:
            *pnInps = iVar4 + 1;
            *pnObjs = iVar4 + iVar5 + 1;
            return 1;
          }
        }
        uVar2 = (int)uVar3 + 0x61;
        format = "String \"%s\" has no symbol \'%c\'.\n";
        goto LAB_004394c3;
      }
LAB_0043941f:
      iVar7 = 0;
    }
  }
  else if ((bVar1 != 0x5b) && (bVar1 != 0x7b)) goto LAB_0043941f;
  if ((((0x35 < bVar1 - 0x28) || ((0x28000000580003U >> ((ulong)(bVar1 - 0x28) & 0x3f) & 1) == 0))
      && (bVar1 != 0x7b)) && ((bVar1 != 0x7d && (0x19 < (byte)(bVar1 + 0xbf))))) {
    if (0x19 < (byte)(bVar1 + 0x9f)) goto LAB_004394b3;
    if (iVar4 <= (char)bVar1 + -0x61) {
      iVar4 = (char)bVar1 + -0x61;
    }
    auStack_21c[bVar1] = 1;
  }
  iVar5 = iVar5 + iVar7;
  pbVar6 = pbVar6 + 1;
  goto LAB_004393f0;
LAB_004394b3:
  uVar2 = (uint)(char)bVar1;
  format = "String \"%s\" contains unrecognized symbol \'%c\'.\n";
LAB_004394c3:
  uStack_a0 = 0x4394ca;
  Ifn_ErrorMessage(format,pStr,(ulong)uVar2);
  return 0;
}

Assistant:

int Ifn_ManStrCheck( char * pStr, int * pnInps, int * pnObjs )
{
    int i, nNodes = 0, Marks[32] = {0}, MaxVar = -1;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( Inf_ManOpenSymb(pStr+i) )
            nNodes++;
        if ( pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            MaxVar = Abc_MaxInt( MaxVar, (int)(pStr[i] - 'a') );
            Marks[pStr[i] - 'a'] = 1;
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; i <= MaxVar; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar + 1;
    *pnObjs = MaxVar + 1 + nNodes;
    return 1;
}